

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O0

void __thiscall
VectorsTest_FP3QuotientScalarAssignment_Test::TestBody
          (VectorsTest_FP3QuotientScalarAssignment_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FP3 v1;
  AssertHelper *in_stack_fffffffffffffec0;
  double *this_00;
  double *in_stack_fffffffffffffec8;
  AssertionResult *pAVar2;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  undefined1 uVar3;
  char *in_stack_fffffffffffffed8;
  int line;
  char *in_stack_fffffffffffffee0;
  double *file;
  undefined8 in_stack_fffffffffffffee8;
  Type TVar4;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined1 uVar5;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 uVar6;
  AssertHelper *in_stack_ffffffffffffff20;
  Vector3<double> local_d0;
  AssertionResult local_b8 [2];
  Vector3<double> local_98;
  AssertionResult local_80;
  uint local_6c;
  Vector3<double> local_48;
  AssertionResult local_30;
  Vector3<double> local_20;
  
  TVar4 = (Type)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  pica::Vector3<double>::Vector3(&local_20,12.0,-24.0,22.0);
  pica::operator/=(&local_20,2.0);
  pica::Vector3<double>::Vector3(&local_48,6.0,-12.0,11.0);
  testing::internal::EqHelper<false>::Compare<double,double>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,(double *)in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_30);
  uVar6 = bVar1;
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    testing::AssertionResult::failure_message((AssertionResult *)0x1e5ab3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),TVar4,
               in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    testing::internal::AssertHelper::operator=
              (in_stack_ffffffffffffff20,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff18));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
    testing::Message::~Message((Message *)0x1e5b10);
  }
  local_6c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5b7e);
  if (local_6c == 0) {
    file = &local_20.y;
    pica::Vector3<double>::Vector3(&local_98,6.0,-12.0,11.0);
    pAVar2 = &local_80;
    testing::internal::EqHelper<false>::Compare<double,double>
              (in_stack_fffffffffffffed8,
               (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,(double *)in_stack_fffffffffffffec0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
    TVar4 = (Type)((ulong)pAVar2 >> 0x20);
    uVar5 = bVar1;
    if (!bVar1) {
      testing::Message::Message((Message *)CONCAT17(bVar1,in_stack_fffffffffffffef0));
      in_stack_fffffffffffffed8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x1e5c55);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffef0),TVar4,(char *)file,
                 (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffff20,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff18));
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffec0);
      testing::Message::~Message((Message *)0x1e5cb2);
    }
    local_6c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5d20);
    if (local_6c == 0) {
      this_00 = &local_20.z;
      pica::Vector3<double>::Vector3(&local_d0,6.0,-12.0,11.0);
      pAVar2 = local_b8;
      testing::internal::EqHelper<false>::Compare<double,double>
                (in_stack_fffffffffffffed8,
                 (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                 (double *)pAVar2,this_00);
      line = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar2);
      if (!bVar1) {
        uVar3 = bVar1;
        testing::Message::Message((Message *)CONCAT17(uVar5,in_stack_fffffffffffffef0));
        testing::AssertionResult::failure_message((AssertionResult *)0x1e5df1);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT17(uVar5,in_stack_fffffffffffffef0),TVar4,(char *)file,line
                   ,(char *)CONCAT17(uVar3,in_stack_fffffffffffffed0));
        testing::internal::AssertHelper::operator=
                  (in_stack_ffffffffffffff20,(Message *)CONCAT17(uVar6,in_stack_ffffffffffffff18));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
        testing::Message::~Message((Message *)0x1e5e3d);
      }
      local_6c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5ea2);
    }
  }
  return;
}

Assistant:

TEST(VectorsTest, FP3QuotientScalarAssignment)
{
    FP3 v1(12, -24, 22);
    v1 /= 2.0;
    ASSERT_EQ_FP3(v1, FP3(6, -12, 11));
}